

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
VectorFormatter<DefaultFormatter>::
Ser<ParamsStream<DataStream&,TransactionSerParams>,std::vector<CTxIn,std::allocator<CTxIn>>>
          (VectorFormatter<DefaultFormatter> *this,
          ParamsStream<DataStream_&,_TransactionSerParams> *s,
          vector<CTxIn,_std::allocator<CTxIn>_> *v)

{
  long lVar1;
  pointer pCVar2;
  value_type *elem;
  pointer args;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<ParamsStream<DataStream&,TransactionSerParams>>
            (s,((long)(v->super__Vector_base<CTxIn,_std::allocator<CTxIn>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(v->super__Vector_base<CTxIn,_std::allocator<CTxIn>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
  pCVar2 = (v->super__Vector_base<CTxIn,_std::allocator<CTxIn>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (args = (v->super__Vector_base<CTxIn,_std::allocator<CTxIn>_>)._M_impl.super__Vector_impl_data
              ._M_start; args != pCVar2; args = args + 1) {
    SerializeMany<ParamsStream<DataStream&,TransactionSerParams>,COutPoint,CScript,unsigned_int>
              (s,&args->prevout,&args->scriptSig,&args->nSequence);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }